

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::sbcd
               (uint8_t rhs,uint8_t lhs,uint8_t *destination,Status *status)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000039;
  ulong uVar6;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,lhs);
  uVar4 = (uint)CONCAT71(in_register_00000039,rhs);
  uVar2 = (uint)(status->extend_flag != 0);
  uVar1 = (uVar3 - uVar4) - uVar2;
  uVar2 = ((uVar3 & 0xf) - (uVar4 & 0xf)) - uVar2;
  uVar5 = uVar2 >> 4 & 6;
  uVar6 = (ulong)(uVar1 - uVar5 & 0x300);
  status->carry_flag = uVar6;
  status->extend_flag = uVar6;
  uVar3 = (uVar2 + (uVar3 & 0xfffffff0)) - (uVar5 | (uVar1 >> 4 & 0x60) + (uVar4 & 0xfffffff0));
  *destination = (uint8_t)uVar3;
  status->zero_result = status->zero_result | (ulong)(uVar3 & 0xff);
  status->negative_flag = (ulong)(*destination & 0xffffff80);
  status->overflow_flag = (ulong)(~uVar3 & uVar1 & 0x80);
  return;
}

Assistant:

inline void sbcd(uint8_t rhs, uint8_t lhs, uint8_t &destination, Status &status) {
	const int extend = (status.extend_flag ? 1 : 0);
	const int unadjusted_result = lhs - rhs - extend;

	const int top = (lhs & 0xf0) - (rhs & 0xf0) - (0x60 & (unadjusted_result >> 4));

	int result = (lhs & 0xf) - (rhs & 0xf) - extend;
	const int low_adjustment = 0x06 & (result >> 4);
	status.extend_flag = status.carry_flag = Status::FlagT(
		(unadjusted_result - low_adjustment) & 0x300
	);
	result = result + top - low_adjustment;

	/* Store the result. */
	destination = uint8_t(result);

	/* Set all remaining flags essentially as if this were normal subtraction. */
	status.zero_result |= destination;
	status.set_negative(destination);
	status.overflow_flag = unadjusted_result & ~result & 0x80;
}